

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# script_tests.cpp
# Opt level: O0

void __thiscall script_tests::script_CHECKMULTISIG12::test_method(script_CHECKMULTISIG12 *this)

{
  span<const_unsigned_char,_18446744073709551615UL> b;
  span<const_unsigned_char,_18446744073709551615UL> b_00;
  bool bVar1;
  lazy_ostream *witness;
  reference pvVar2;
  long in_FS_OFFSET;
  CMutableTransaction txTo12;
  CKey key3;
  CKey key2;
  CKey key1;
  ScriptError err;
  CScript badsig1;
  CScript goodsig2;
  CScript goodsig1;
  CTransaction txFrom12;
  CScript scriptPubKey12;
  CTransaction *in_stack_fffffffffffff5b8;
  undefined7 in_stack_fffffffffffff5c0;
  undefined1 in_stack_fffffffffffff5c7;
  undefined4 in_stack_fffffffffffff5c8;
  uint in_stack_fffffffffffff5cc;
  CMutableTransaction *in_stack_fffffffffffff5d0;
  GenericTransactionSignatureChecker<CMutableTransaction> *in_stack_fffffffffffff5d8;
  undefined7 in_stack_fffffffffffff5e0;
  undefined1 in_stack_fffffffffffff5e7;
  CTransaction *in_stack_fffffffffffff5e8;
  undefined4 in_stack_fffffffffffff5f0;
  undefined4 in_stack_fffffffffffff5f4;
  __extent_storage<18446744073709551615UL> in_stack_fffffffffffff5f8;
  CScript *this_00;
  undefined8 in_stack_fffffffffffff608;
  int nValue;
  CTransaction *in_stack_fffffffffffff610;
  undefined7 in_stack_fffffffffffff618;
  undefined1 in_stack_fffffffffffff61f;
  CScript *in_stack_fffffffffffff620;
  undefined4 in_stack_fffffffffffff660;
  undefined4 in_stack_fffffffffffff664;
  undefined4 uVar3;
  BaseSignatureChecker *in_stack_fffffffffffff668;
  CScript *checker;
  uint in_stack_fffffffffffff674;
  CScriptWitness *in_stack_fffffffffffff678;
  CScript *in_stack_fffffffffffff680;
  CScript *scriptPubKey;
  undefined7 in_stack_fffffffffffff688;
  undefined1 in_stack_fffffffffffff68f;
  const_string local_8e8;
  lazy_ostream local_8d8 [2];
  ScriptError in_stack_fffffffffffff78c;
  lazy_ostream local_860 [4];
  assertion_result local_818 [2];
  const_string local_7e0;
  lazy_ostream local_7d0 [2];
  assertion_result local_7b0 [2];
  const_string local_778 [2];
  lazy_ostream local_758 [4];
  assertion_result local_710 [2];
  const_string local_6d8;
  lazy_ostream local_6c8 [2];
  assertion_result local_6a8 [2];
  const_string local_670 [2];
  lazy_ostream local_650 [4];
  assertion_result local_608 [2];
  const_string local_5d0;
  lazy_ostream local_5c0 [2];
  assertion_result local_5a0 [2];
  const_string local_568 [2];
  lazy_ostream local_548 [4];
  assertion_result local_500 [2];
  undefined8 local_4c8;
  undefined8 uStack_4c0;
  undefined8 local_4b8;
  undefined8 local_158;
  undefined8 uStack_150;
  undefined8 local_148;
  undefined8 uStack_140;
  long local_8;
  
  nValue = (int)((ulong)in_stack_fffffffffffff608 >> 0x20);
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  GenerateRandomKey((bool)in_stack_fffffffffffff5c7);
  GenerateRandomKey((bool)in_stack_fffffffffffff5c7);
  GenerateRandomKey((bool)in_stack_fffffffffffff5c7);
  CScript::CScript((CScript *)in_stack_fffffffffffff5b8);
  CScript::operator<<((CScript *)CONCAT44(in_stack_fffffffffffff5f4,in_stack_fffffffffffff5f0),
                      (opcodetype)((ulong)in_stack_fffffffffffff5e8 >> 0x20));
  CKey::GetPubKey((CKey *)CONCAT17(in_stack_fffffffffffff5e7,in_stack_fffffffffffff5e0));
  ToByteVector<CPubKey>((CPubKey *)in_stack_fffffffffffff5f8._M_extent_value);
  std::span<const_unsigned_char,_18446744073709551615UL>::
  span<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
            ((span<const_unsigned_char,_18446744073709551615UL> *)
             CONCAT44(in_stack_fffffffffffff5cc,in_stack_fffffffffffff5c8),
             (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
             CONCAT17(in_stack_fffffffffffff5c7,in_stack_fffffffffffff5c0));
  b._M_ptr._4_4_ = in_stack_fffffffffffff5f4;
  b._M_ptr._0_4_ = in_stack_fffffffffffff5f0;
  b._M_extent._M_extent_value = in_stack_fffffffffffff5f8._M_extent_value;
  CScript::operator<<((CScript *)in_stack_fffffffffffff5d8,b);
  CKey::GetPubKey((CKey *)CONCAT17(in_stack_fffffffffffff5e7,in_stack_fffffffffffff5e0));
  ToByteVector<CPubKey>((CPubKey *)in_stack_fffffffffffff5f8._M_extent_value);
  std::span<const_unsigned_char,_18446744073709551615UL>::
  span<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
            ((span<const_unsigned_char,_18446744073709551615UL> *)
             CONCAT44(in_stack_fffffffffffff5cc,in_stack_fffffffffffff5c8),
             (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
             CONCAT17(in_stack_fffffffffffff5c7,in_stack_fffffffffffff5c0));
  b_00._M_ptr._4_4_ = in_stack_fffffffffffff5f4;
  b_00._M_ptr._0_4_ = in_stack_fffffffffffff5f0;
  b_00._M_extent._M_extent_value = in_stack_fffffffffffff5f8._M_extent_value;
  CScript::operator<<((CScript *)in_stack_fffffffffffff5d8,b_00);
  CScript::operator<<((CScript *)CONCAT44(in_stack_fffffffffffff5f4,in_stack_fffffffffffff5f0),
                      (opcodetype)((ulong)in_stack_fffffffffffff5e8 >> 0x20));
  CScript::operator<<((CScript *)CONCAT44(in_stack_fffffffffffff5f4,in_stack_fffffffffffff5f0),
                      (opcodetype)((ulong)in_stack_fffffffffffff5e8 >> 0x20));
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
             CONCAT44(in_stack_fffffffffffff5cc,in_stack_fffffffffffff5c8));
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
             CONCAT44(in_stack_fffffffffffff5cc,in_stack_fffffffffffff5c8));
  BuildCreditingTransaction((CScript *)in_stack_fffffffffffff610,nValue);
  CTransaction::CTransaction
            ((CTransaction *)in_stack_fffffffffffff5f8._M_extent_value,
             (CMutableTransaction *)CONCAT44(in_stack_fffffffffffff5f4,in_stack_fffffffffffff5f0));
  CMutableTransaction::~CMutableTransaction((CMutableTransaction *)in_stack_fffffffffffff5b8);
  local_148 = 0;
  uStack_140 = 0;
  local_158 = 0;
  uStack_150 = 0;
  CScript::CScript((CScript *)in_stack_fffffffffffff5b8);
  local_4c8 = 0;
  uStack_4c0 = 0;
  local_4b8 = 0;
  CScriptWitness::CScriptWitness((CScriptWitness *)in_stack_fffffffffffff5b8);
  BuildSpendingTransaction
            (in_stack_fffffffffffff620,
             (CScriptWitness *)CONCAT17(in_stack_fffffffffffff61f,in_stack_fffffffffffff618),
             in_stack_fffffffffffff610);
  CScriptWitness::~CScriptWitness((CScriptWitness *)in_stack_fffffffffffff5b8);
  CScript::~CScript((CScript *)in_stack_fffffffffffff5b8);
  CTransaction::CTransaction
            ((CTransaction *)in_stack_fffffffffffff5f8._M_extent_value,
             (CMutableTransaction *)CONCAT44(in_stack_fffffffffffff5f4,in_stack_fffffffffffff5f0));
  sign_multisig((CScript *)in_stack_fffffffffffff5f8._M_extent_value,
                (CKey *)CONCAT44(in_stack_fffffffffffff5f4,in_stack_fffffffffffff5f0),
                in_stack_fffffffffffff5e8);
  CTransaction::~CTransaction(in_stack_fffffffffffff5b8);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT44(in_stack_fffffffffffff5cc,in_stack_fffffffffffff5c8),
               (pointer)CONCAT17(in_stack_fffffffffffff5c7,in_stack_fffffffffffff5c0),
               (unsigned_long)in_stack_fffffffffffff5b8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff5b8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_fffffffffffff5f8._M_extent_value,
               (const_string *)CONCAT44(in_stack_fffffffffffff5f4,in_stack_fffffffffffff5f0),
               (size_t)in_stack_fffffffffffff5e8,
               (const_string *)CONCAT17(in_stack_fffffffffffff5e7,in_stack_fffffffffffff5e0));
    std::vector<CTxOut,_std::allocator<CTxOut>_>::operator[]
              ((vector<CTxOut,_std::allocator<CTxOut>_> *)
               CONCAT44(in_stack_fffffffffffff5cc,in_stack_fffffffffffff5c8),
               CONCAT17(in_stack_fffffffffffff5c7,in_stack_fffffffffffff5c0));
    GenericTransactionSignatureChecker<CMutableTransaction>::GenericTransactionSignatureChecker
              (in_stack_fffffffffffff5d8,in_stack_fffffffffffff5d0,in_stack_fffffffffffff5cc,
               (CAmount *)CONCAT17(in_stack_fffffffffffff5c7,in_stack_fffffffffffff5c0),
               (MissingDataBehavior)((ulong)in_stack_fffffffffffff5b8 >> 0x20));
    VerifyScript((CScript *)CONCAT17(in_stack_fffffffffffff68f,in_stack_fffffffffffff688),
                 in_stack_fffffffffffff680,in_stack_fffffffffffff678,in_stack_fffffffffffff674,
                 in_stack_fffffffffffff668,
                 (ScriptError *)CONCAT44(in_stack_fffffffffffff664,in_stack_fffffffffffff660));
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)CONCAT44(in_stack_fffffffffffff5cc,in_stack_fffffffffffff5c8),
               (bool)in_stack_fffffffffffff5c7);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT44(in_stack_fffffffffffff5cc,in_stack_fffffffffffff5c8),
               (pointer)CONCAT17(in_stack_fffffffffffff5c7,in_stack_fffffffffffff5c0),
               (unsigned_long)in_stack_fffffffffffff5b8);
    boost::unit_test::operator<<
              ((lazy_ostream *)CONCAT17(in_stack_fffffffffffff5c7,in_stack_fffffffffffff5c0),
               (basic_cstring<const_char> *)in_stack_fffffffffffff5b8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT44(in_stack_fffffffffffff5cc,in_stack_fffffffffffff5c8),
               (pointer)CONCAT17(in_stack_fffffffffffff5c7,in_stack_fffffffffffff5c0),
               (unsigned_long)in_stack_fffffffffffff5b8);
    in_stack_fffffffffffff5b8 = (CTransaction *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_500,local_548,local_568,0x41a,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_fffffffffffff5b8);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_fffffffffffff5b8);
    GenericTransactionSignatureChecker<CMutableTransaction>::~GenericTransactionSignatureChecker
              ((GenericTransactionSignatureChecker<CMutableTransaction> *)in_stack_fffffffffffff5b8)
    ;
    in_stack_fffffffffffff68f = boost::test_tools::tt_detail::dummy_cond();
  } while ((bool)in_stack_fffffffffffff68f);
  do {
    scriptPubKey = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT44(in_stack_fffffffffffff5cc,in_stack_fffffffffffff5c8),
               (pointer)CONCAT17(in_stack_fffffffffffff5c7,in_stack_fffffffffffff5c0),
               (unsigned_long)in_stack_fffffffffffff5b8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff5b8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_fffffffffffff5f8._M_extent_value,
               (const_string *)CONCAT44(in_stack_fffffffffffff5f4,in_stack_fffffffffffff5f0),
               (size_t)in_stack_fffffffffffff5e8,
               (const_string *)CONCAT17(in_stack_fffffffffffff5e7,in_stack_fffffffffffff5e0));
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)CONCAT44(in_stack_fffffffffffff5cc,in_stack_fffffffffffff5c8),
               (bool)in_stack_fffffffffffff5c7);
    witness = boost::unit_test::lazy_ostream::instance();
    ScriptErrorString_abi_cxx11_(in_stack_fffffffffffff78c);
    boost::unit_test::operator<<
              ((lazy_ostream *)CONCAT17(in_stack_fffffffffffff5c7,in_stack_fffffffffffff5c0),
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffff5b8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT44(in_stack_fffffffffffff5cc,in_stack_fffffffffffff5c8),
               (pointer)CONCAT17(in_stack_fffffffffffff5c7,in_stack_fffffffffffff5c0),
               (unsigned_long)in_stack_fffffffffffff5b8);
    in_stack_fffffffffffff5b8 = (CTransaction *)0x0;
    boost::test_tools::tt_detail::report_assertion(local_5a0,local_5c0,&local_5d0,0x41b,CHECK);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                *)in_stack_fffffffffffff5b8);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffff5b8);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_fffffffffffff5b8);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
    in_stack_fffffffffffff674 = CONCAT13(bVar1,(int3)in_stack_fffffffffffff674);
  } while (bVar1);
  pvVar2 = std::vector<CTxOut,_std::allocator<CTxOut>_>::operator[]
                     ((vector<CTxOut,_std::allocator<CTxOut>_> *)
                      CONCAT44(in_stack_fffffffffffff5cc,in_stack_fffffffffffff5c8),
                      CONCAT17(in_stack_fffffffffffff5c7,in_stack_fffffffffffff5c0));
  pvVar2->nValue = 2;
  do {
    checker = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT44(in_stack_fffffffffffff5cc,in_stack_fffffffffffff5c8),
               (pointer)CONCAT17(in_stack_fffffffffffff5c7,in_stack_fffffffffffff5c0),
               (unsigned_long)in_stack_fffffffffffff5b8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff5b8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_fffffffffffff5f8._M_extent_value,
               (const_string *)CONCAT44(in_stack_fffffffffffff5f4,in_stack_fffffffffffff5f0),
               (size_t)in_stack_fffffffffffff5e8,
               (const_string *)CONCAT17(in_stack_fffffffffffff5e7,in_stack_fffffffffffff5e0));
    uVar3 = 0;
    std::vector<CTxOut,_std::allocator<CTxOut>_>::operator[]
              ((vector<CTxOut,_std::allocator<CTxOut>_> *)
               CONCAT44(in_stack_fffffffffffff5cc,in_stack_fffffffffffff5c8),
               CONCAT17(in_stack_fffffffffffff5c7,in_stack_fffffffffffff5c0));
    GenericTransactionSignatureChecker<CMutableTransaction>::GenericTransactionSignatureChecker
              (in_stack_fffffffffffff5d8,in_stack_fffffffffffff5d0,in_stack_fffffffffffff5cc,
               (CAmount *)CONCAT17(in_stack_fffffffffffff5c7,in_stack_fffffffffffff5c0),
               (MissingDataBehavior)((ulong)in_stack_fffffffffffff5b8 >> 0x20));
    bVar1 = VerifyScript((CScript *)CONCAT17(in_stack_fffffffffffff68f,in_stack_fffffffffffff688),
                         scriptPubKey,(CScriptWitness *)witness,in_stack_fffffffffffff674,
                         (BaseSignatureChecker *)checker,
                         (ScriptError *)CONCAT44(uVar3,in_stack_fffffffffffff660));
    in_stack_fffffffffffff660 = CONCAT13(bVar1,(int3)in_stack_fffffffffffff660);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)CONCAT44(in_stack_fffffffffffff5cc,in_stack_fffffffffffff5c8),
               (bool)in_stack_fffffffffffff5c7);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT44(in_stack_fffffffffffff5cc,in_stack_fffffffffffff5c8),
               (pointer)CONCAT17(in_stack_fffffffffffff5c7,in_stack_fffffffffffff5c0),
               (unsigned_long)in_stack_fffffffffffff5b8);
    boost::unit_test::operator<<
              ((lazy_ostream *)CONCAT17(in_stack_fffffffffffff5c7,in_stack_fffffffffffff5c0),
               (basic_cstring<const_char> *)in_stack_fffffffffffff5b8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT44(in_stack_fffffffffffff5cc,in_stack_fffffffffffff5c8),
               (pointer)CONCAT17(in_stack_fffffffffffff5c7,in_stack_fffffffffffff5c0),
               (unsigned_long)in_stack_fffffffffffff5b8);
    in_stack_fffffffffffff5b8 = (CTransaction *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_608,local_650,local_670,0x41d,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_fffffffffffff5b8);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_fffffffffffff5b8);
    GenericTransactionSignatureChecker<CMutableTransaction>::~GenericTransactionSignatureChecker
              ((GenericTransactionSignatureChecker<CMutableTransaction> *)in_stack_fffffffffffff5b8)
    ;
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT44(in_stack_fffffffffffff5cc,in_stack_fffffffffffff5c8),
               (pointer)CONCAT17(in_stack_fffffffffffff5c7,in_stack_fffffffffffff5c0),
               (unsigned_long)in_stack_fffffffffffff5b8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff5b8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_fffffffffffff5f8._M_extent_value,
               (const_string *)CONCAT44(in_stack_fffffffffffff5f4,in_stack_fffffffffffff5f0),
               (size_t)in_stack_fffffffffffff5e8,
               (const_string *)CONCAT17(in_stack_fffffffffffff5e7,in_stack_fffffffffffff5e0));
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)CONCAT44(in_stack_fffffffffffff5cc,in_stack_fffffffffffff5c8),
               (bool)in_stack_fffffffffffff5c7);
    boost::unit_test::lazy_ostream::instance();
    ScriptErrorString_abi_cxx11_(in_stack_fffffffffffff78c);
    boost::unit_test::operator<<
              ((lazy_ostream *)CONCAT17(in_stack_fffffffffffff5c7,in_stack_fffffffffffff5c0),
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffff5b8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT44(in_stack_fffffffffffff5cc,in_stack_fffffffffffff5c8),
               (pointer)CONCAT17(in_stack_fffffffffffff5c7,in_stack_fffffffffffff5c0),
               (unsigned_long)in_stack_fffffffffffff5b8);
    in_stack_fffffffffffff5b8 = (CTransaction *)0x0;
    boost::test_tools::tt_detail::report_assertion(local_6a8,local_6c8,&local_6d8,0x41e,CHECK);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                *)in_stack_fffffffffffff5b8);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffff5b8);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_fffffffffffff5b8);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  CTransaction::CTransaction
            ((CTransaction *)in_stack_fffffffffffff5f8._M_extent_value,
             (CMutableTransaction *)CONCAT44(in_stack_fffffffffffff5f4,in_stack_fffffffffffff5f0));
  sign_multisig((CScript *)in_stack_fffffffffffff5f8._M_extent_value,
                (CKey *)CONCAT44(in_stack_fffffffffffff5f4,in_stack_fffffffffffff5f0),
                in_stack_fffffffffffff5e8);
  CTransaction::~CTransaction(in_stack_fffffffffffff5b8);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT44(in_stack_fffffffffffff5cc,in_stack_fffffffffffff5c8),
               (pointer)CONCAT17(in_stack_fffffffffffff5c7,in_stack_fffffffffffff5c0),
               (unsigned_long)in_stack_fffffffffffff5b8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff5b8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_fffffffffffff5f8._M_extent_value,
               (const_string *)CONCAT44(in_stack_fffffffffffff5f4,in_stack_fffffffffffff5f0),
               (size_t)in_stack_fffffffffffff5e8,
               (const_string *)CONCAT17(in_stack_fffffffffffff5e7,in_stack_fffffffffffff5e0));
    std::vector<CTxOut,_std::allocator<CTxOut>_>::operator[]
              ((vector<CTxOut,_std::allocator<CTxOut>_> *)
               CONCAT44(in_stack_fffffffffffff5cc,in_stack_fffffffffffff5c8),
               CONCAT17(in_stack_fffffffffffff5c7,in_stack_fffffffffffff5c0));
    GenericTransactionSignatureChecker<CMutableTransaction>::GenericTransactionSignatureChecker
              (in_stack_fffffffffffff5d8,in_stack_fffffffffffff5d0,in_stack_fffffffffffff5cc,
               (CAmount *)CONCAT17(in_stack_fffffffffffff5c7,in_stack_fffffffffffff5c0),
               (MissingDataBehavior)((ulong)in_stack_fffffffffffff5b8 >> 0x20));
    VerifyScript((CScript *)CONCAT17(in_stack_fffffffffffff68f,in_stack_fffffffffffff688),
                 scriptPubKey,(CScriptWitness *)witness,in_stack_fffffffffffff674,
                 (BaseSignatureChecker *)checker,
                 (ScriptError *)CONCAT44(uVar3,in_stack_fffffffffffff660));
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)CONCAT44(in_stack_fffffffffffff5cc,in_stack_fffffffffffff5c8),
               (bool)in_stack_fffffffffffff5c7);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT44(in_stack_fffffffffffff5cc,in_stack_fffffffffffff5c8),
               (pointer)CONCAT17(in_stack_fffffffffffff5c7,in_stack_fffffffffffff5c0),
               (unsigned_long)in_stack_fffffffffffff5b8);
    boost::unit_test::operator<<
              ((lazy_ostream *)CONCAT17(in_stack_fffffffffffff5c7,in_stack_fffffffffffff5c0),
               (basic_cstring<const_char> *)in_stack_fffffffffffff5b8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT44(in_stack_fffffffffffff5cc,in_stack_fffffffffffff5c8),
               (pointer)CONCAT17(in_stack_fffffffffffff5c7,in_stack_fffffffffffff5c0),
               (unsigned_long)in_stack_fffffffffffff5b8);
    in_stack_fffffffffffff5b8 = (CTransaction *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_710,local_758,local_778,0x421,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_fffffffffffff5b8);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_fffffffffffff5b8);
    GenericTransactionSignatureChecker<CMutableTransaction>::~GenericTransactionSignatureChecker
              ((GenericTransactionSignatureChecker<CMutableTransaction> *)in_stack_fffffffffffff5b8)
    ;
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT44(in_stack_fffffffffffff5cc,in_stack_fffffffffffff5c8),
               (pointer)CONCAT17(in_stack_fffffffffffff5c7,in_stack_fffffffffffff5c0),
               (unsigned_long)in_stack_fffffffffffff5b8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff5b8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_fffffffffffff5f8._M_extent_value,
               (const_string *)CONCAT44(in_stack_fffffffffffff5f4,in_stack_fffffffffffff5f0),
               (size_t)in_stack_fffffffffffff5e8,
               (const_string *)CONCAT17(in_stack_fffffffffffff5e7,in_stack_fffffffffffff5e0));
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)CONCAT44(in_stack_fffffffffffff5cc,in_stack_fffffffffffff5c8),
               (bool)in_stack_fffffffffffff5c7);
    boost::unit_test::lazy_ostream::instance();
    ScriptErrorString_abi_cxx11_(in_stack_fffffffffffff78c);
    boost::unit_test::operator<<
              ((lazy_ostream *)CONCAT17(in_stack_fffffffffffff5c7,in_stack_fffffffffffff5c0),
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffff5b8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT44(in_stack_fffffffffffff5cc,in_stack_fffffffffffff5c8),
               (pointer)CONCAT17(in_stack_fffffffffffff5c7,in_stack_fffffffffffff5c0),
               (unsigned_long)in_stack_fffffffffffff5b8);
    in_stack_fffffffffffff5b8 = (CTransaction *)0x0;
    boost::test_tools::tt_detail::report_assertion(local_7b0,local_7d0,&local_7e0,0x422,CHECK);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                *)in_stack_fffffffffffff5b8);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffff5b8);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_fffffffffffff5b8);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  CTransaction::CTransaction
            ((CTransaction *)in_stack_fffffffffffff5f8._M_extent_value,
             (CMutableTransaction *)CONCAT44(in_stack_fffffffffffff5f4,in_stack_fffffffffffff5f0));
  sign_multisig((CScript *)in_stack_fffffffffffff5f8._M_extent_value,
                (CKey *)CONCAT44(in_stack_fffffffffffff5f4,in_stack_fffffffffffff5f0),
                in_stack_fffffffffffff5e8);
  CTransaction::~CTransaction(in_stack_fffffffffffff5b8);
  do {
    this_00 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT44(in_stack_fffffffffffff5cc,in_stack_fffffffffffff5c8),
               (pointer)CONCAT17(in_stack_fffffffffffff5c7,in_stack_fffffffffffff5c0),
               (unsigned_long)in_stack_fffffffffffff5b8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff5b8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)this_00,
               (const_string *)CONCAT44(in_stack_fffffffffffff5f4,in_stack_fffffffffffff5f0),
               (size_t)in_stack_fffffffffffff5e8,
               (const_string *)CONCAT17(in_stack_fffffffffffff5e7,in_stack_fffffffffffff5e0));
    in_stack_fffffffffffff5f4 = 0;
    std::vector<CTxOut,_std::allocator<CTxOut>_>::operator[]
              ((vector<CTxOut,_std::allocator<CTxOut>_> *)
               CONCAT44(in_stack_fffffffffffff5cc,in_stack_fffffffffffff5c8),
               CONCAT17(in_stack_fffffffffffff5c7,in_stack_fffffffffffff5c0));
    GenericTransactionSignatureChecker<CMutableTransaction>::GenericTransactionSignatureChecker
              (in_stack_fffffffffffff5d8,in_stack_fffffffffffff5d0,in_stack_fffffffffffff5cc,
               (CAmount *)CONCAT17(in_stack_fffffffffffff5c7,in_stack_fffffffffffff5c0),
               (MissingDataBehavior)((ulong)in_stack_fffffffffffff5b8 >> 0x20));
    bVar1 = VerifyScript((CScript *)CONCAT17(in_stack_fffffffffffff68f,in_stack_fffffffffffff688),
                         scriptPubKey,(CScriptWitness *)witness,in_stack_fffffffffffff674,
                         (BaseSignatureChecker *)checker,
                         (ScriptError *)CONCAT44(uVar3,in_stack_fffffffffffff660));
    in_stack_fffffffffffff5f0 = CONCAT13(bVar1,(int3)in_stack_fffffffffffff5f0);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)CONCAT44(in_stack_fffffffffffff5cc,in_stack_fffffffffffff5c8),
               (bool)in_stack_fffffffffffff5c7);
    in_stack_fffffffffffff5e8 = (CTransaction *)boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT44(in_stack_fffffffffffff5cc,in_stack_fffffffffffff5c8),
               (pointer)CONCAT17(in_stack_fffffffffffff5c7,in_stack_fffffffffffff5c0),
               (unsigned_long)in_stack_fffffffffffff5b8);
    boost::unit_test::operator<<
              ((lazy_ostream *)CONCAT17(in_stack_fffffffffffff5c7,in_stack_fffffffffffff5c0),
               (basic_cstring<const_char> *)in_stack_fffffffffffff5b8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT44(in_stack_fffffffffffff5cc,in_stack_fffffffffffff5c8),
               (pointer)CONCAT17(in_stack_fffffffffffff5c7,in_stack_fffffffffffff5c0),
               (unsigned_long)in_stack_fffffffffffff5b8);
    in_stack_fffffffffffff5b8 = (CTransaction *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_818,local_860,(const_string *)&stack0xfffffffffffff780,0x425,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_fffffffffffff5b8);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_fffffffffffff5b8);
    GenericTransactionSignatureChecker<CMutableTransaction>::~GenericTransactionSignatureChecker
              ((GenericTransactionSignatureChecker<CMutableTransaction> *)in_stack_fffffffffffff5b8)
    ;
    in_stack_fffffffffffff5e7 = boost::test_tools::tt_detail::dummy_cond();
  } while ((bool)in_stack_fffffffffffff5e7);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT44(in_stack_fffffffffffff5cc,in_stack_fffffffffffff5c8),
               (pointer)CONCAT17(in_stack_fffffffffffff5c7,in_stack_fffffffffffff5c0),
               (unsigned_long)in_stack_fffffffffffff5b8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff5b8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)this_00,
               (const_string *)CONCAT44(in_stack_fffffffffffff5f4,in_stack_fffffffffffff5f0),
               (size_t)in_stack_fffffffffffff5e8,
               (const_string *)CONCAT17(in_stack_fffffffffffff5e7,in_stack_fffffffffffff5e0));
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)CONCAT44(in_stack_fffffffffffff5cc,in_stack_fffffffffffff5c8),
               (bool)in_stack_fffffffffffff5c7);
    boost::unit_test::lazy_ostream::instance();
    ScriptErrorString_abi_cxx11_(in_stack_fffffffffffff78c);
    boost::unit_test::operator<<
              ((lazy_ostream *)CONCAT17(in_stack_fffffffffffff5c7,in_stack_fffffffffffff5c0),
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffff5b8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT44(in_stack_fffffffffffff5cc,in_stack_fffffffffffff5c8),
               (pointer)CONCAT17(in_stack_fffffffffffff5c7,in_stack_fffffffffffff5c0),
               (unsigned_long)in_stack_fffffffffffff5b8);
    in_stack_fffffffffffff5b8 = (CTransaction *)0x0;
    boost::test_tools::tt_detail::report_assertion
              ((assertion_result *)&stack0xfffffffffffff748,local_8d8,&local_8e8,0x426,CHECK);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                *)in_stack_fffffffffffff5b8);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffff5b8);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_fffffffffffff5b8);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
    in_stack_fffffffffffff5cc = CONCAT13(bVar1,(int3)in_stack_fffffffffffff5cc);
  } while (bVar1);
  CScript::~CScript((CScript *)in_stack_fffffffffffff5b8);
  CScript::~CScript((CScript *)in_stack_fffffffffffff5b8);
  CScript::~CScript((CScript *)in_stack_fffffffffffff5b8);
  CMutableTransaction::~CMutableTransaction((CMutableTransaction *)in_stack_fffffffffffff5b8);
  CTransaction::~CTransaction(in_stack_fffffffffffff5b8);
  CScript::~CScript((CScript *)in_stack_fffffffffffff5b8);
  CKey::~CKey((CKey *)in_stack_fffffffffffff5b8);
  CKey::~CKey((CKey *)in_stack_fffffffffffff5b8);
  CKey::~CKey((CKey *)in_stack_fffffffffffff5b8);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(script_CHECKMULTISIG12)
{
    ScriptError err;
    CKey key1 = GenerateRandomKey();
    CKey key2 = GenerateRandomKey(/*compressed=*/false);
    CKey key3 = GenerateRandomKey();

    CScript scriptPubKey12;
    scriptPubKey12 << OP_1 << ToByteVector(key1.GetPubKey()) << ToByteVector(key2.GetPubKey()) << OP_2 << OP_CHECKMULTISIG;

    const CTransaction txFrom12{BuildCreditingTransaction(scriptPubKey12)};
    CMutableTransaction txTo12 = BuildSpendingTransaction(CScript(), CScriptWitness(), txFrom12);

    CScript goodsig1 = sign_multisig(scriptPubKey12, key1, CTransaction(txTo12));
    BOOST_CHECK(VerifyScript(goodsig1, scriptPubKey12, nullptr, gFlags, MutableTransactionSignatureChecker(&txTo12, 0, txFrom12.vout[0].nValue, MissingDataBehavior::ASSERT_FAIL), &err));
    BOOST_CHECK_MESSAGE(err == SCRIPT_ERR_OK, ScriptErrorString(err));
    txTo12.vout[0].nValue = 2;
    BOOST_CHECK(!VerifyScript(goodsig1, scriptPubKey12, nullptr, gFlags, MutableTransactionSignatureChecker(&txTo12, 0, txFrom12.vout[0].nValue, MissingDataBehavior::ASSERT_FAIL), &err));
    BOOST_CHECK_MESSAGE(err == SCRIPT_ERR_EVAL_FALSE, ScriptErrorString(err));

    CScript goodsig2 = sign_multisig(scriptPubKey12, key2, CTransaction(txTo12));
    BOOST_CHECK(VerifyScript(goodsig2, scriptPubKey12, nullptr, gFlags, MutableTransactionSignatureChecker(&txTo12, 0, txFrom12.vout[0].nValue, MissingDataBehavior::ASSERT_FAIL), &err));
    BOOST_CHECK_MESSAGE(err == SCRIPT_ERR_OK, ScriptErrorString(err));

    CScript badsig1 = sign_multisig(scriptPubKey12, key3, CTransaction(txTo12));
    BOOST_CHECK(!VerifyScript(badsig1, scriptPubKey12, nullptr, gFlags, MutableTransactionSignatureChecker(&txTo12, 0, txFrom12.vout[0].nValue, MissingDataBehavior::ASSERT_FAIL), &err));
    BOOST_CHECK_MESSAGE(err == SCRIPT_ERR_EVAL_FALSE, ScriptErrorString(err));
}